

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O3

void finish_example(vw *all,audit_regressor_data *dd,example *ec)

{
  bool bVar1;
  _func_int *p_Var2;
  shared_data *psVar3;
  ostream *poVar4;
  long lVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  char local_3a [2];
  ulong local_38;
  
  if (((float)(ec->example_counter + 1) < all->sd->dump_interval) || (all->quiet == true)) {
    if (dd->values_audited != dd->loaded_regressor_values) goto LAB_001f6efb;
    p_Var2 = (all->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var2 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var2 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) &
         0xffffff4f | 0x20;
    *(undefined8 *)
     ((all->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(all->trace_message).super_ostream._vptr_basic_ostream) = 0xc;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&all->trace_message);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 9;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 0xc;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    local_3a[1] = 0x25;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3a + 1,1);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    local_38 = (dd->values_audited * 100) / dd->loaded_regressor_values;
    p_Var2 = (all->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var2 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var2 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) &
         0xffffff4f | 0x20;
    *(undefined8 *)
     ((all->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(all->trace_message).super_ostream._vptr_basic_ostream) = 0xc;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&all->trace_message);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 9;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 0xc;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    local_3a[0] = '%';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3a,1);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar5 = ec->example_counter + 1;
    auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = 0x45300000;
    all->sd->weighted_unlabeled_examples =
         (auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
    psVar3 = all->sd;
    bVar1 = all->progress_add;
    fVar6 = all->progress_arg;
    psVar3->sum_loss_since_last_dump = 0.0;
    psVar3->old_weighted_labeled_examples = psVar3->weighted_labeled_examples;
    fVar8 = (float)(psVar3->weighted_labeled_examples + psVar3->weighted_unlabeled_examples);
    if (bVar1 == false) {
      fVar6 = fVar6 * fVar8;
    }
    else {
      fVar6 = fVar6 + fVar8;
    }
    psVar3->dump_interval = fVar6;
    if (dd->values_audited != dd->loaded_regressor_values) goto LAB_001f6efb;
  }
  set_done(all);
LAB_001f6efb:
  VW::finish_example(all,ec);
  return;
}

Assistant:

void finish_example(vw& all, audit_regressor_data& dd, example& ec)
{
  bool printed = false;
  if (ec.example_counter + 1 >= all.sd->dump_interval && !all.quiet)
  {
    print_ex(all, ec.example_counter + 1, dd.values_audited, dd.values_audited * 100 / dd.loaded_regressor_values);
    all.sd->weighted_unlabeled_examples = (double)(ec.example_counter + 1);  // used in update_dump_interval
    all.sd->update_dump_interval(all.progress_add, all.progress_arg);
    printed = true;
  }

  if (dd.values_audited == dd.loaded_regressor_values)
  {
    // all regressor values were audited
    if (!printed)
      print_ex(all, ec.example_counter + 1, dd.values_audited, 100);
    set_done(all);
  }

  VW::finish_example(all, ec);
}